

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.h
# Opt level: O0

void __thiscall
pbrt::CoatedDiffuseMaterial::CoatedDiffuseMaterial
          (CoatedDiffuseMaterial *this,SpectrumTextureHandle *reflectance,
          FloatTextureHandle *uRoughness,FloatTextureHandle *vRoughness,
          FloatTextureHandle *thickness,SpectrumTextureHandle *albedo,FloatTextureHandle *g,
          FloatTextureHandle *eta,FloatTextureHandle *displacement,bool remapRoughness,
          LayeredBxDFConfig config)

{
  FloatTextureHandle *in_RSI;
  long in_RDI;
  FloatTextureHandle *in_R9;
  byte in_stack_00000020;
  undefined2 in_stack_00000028;
  undefined1 in_stack_0000002a;
  
  FloatTextureHandle::FloatTextureHandle(in_R9,in_RSI);
  SpectrumTextureHandle::SpectrumTextureHandle
            ((SpectrumTextureHandle *)in_R9,(SpectrumTextureHandle *)in_RSI);
  SpectrumTextureHandle::SpectrumTextureHandle
            ((SpectrumTextureHandle *)in_R9,(SpectrumTextureHandle *)in_RSI);
  FloatTextureHandle::FloatTextureHandle(in_R9,in_RSI);
  FloatTextureHandle::FloatTextureHandle(in_R9,in_RSI);
  FloatTextureHandle::FloatTextureHandle(in_R9,in_RSI);
  FloatTextureHandle::FloatTextureHandle(in_R9,in_RSI);
  FloatTextureHandle::FloatTextureHandle(in_R9,in_RSI);
  *(byte *)(in_RDI + 0x40) = in_stack_00000020 & 1;
  *(undefined2 *)(in_RDI + 0x41) = in_stack_00000028;
  *(undefined1 *)(in_RDI + 0x43) = in_stack_0000002a;
  return;
}

Assistant:

CoatedDiffuseMaterial(SpectrumTextureHandle reflectance,
                          FloatTextureHandle uRoughness, FloatTextureHandle vRoughness,
                          FloatTextureHandle thickness, SpectrumTextureHandle albedo,
                          FloatTextureHandle g, FloatTextureHandle eta,
                          FloatTextureHandle displacement, bool remapRoughness,
                          LayeredBxDFConfig config)
        : displacement(displacement),
          reflectance(reflectance),
          uRoughness(uRoughness),
          vRoughness(vRoughness),
          thickness(thickness),
          albedo(albedo),
          g(g),
          eta(eta),
          remapRoughness(remapRoughness),
          config(config) {}